

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O0

void __thiscall PDA::Transducer::StoreFst::StoreFst(StoreFst *this,Grammar *grammar)

{
  Grammar *grammar_local;
  StoreFst *this_local;
  
  State::State(&this->m_currentState,L'S');
  State::State(&this->m_mostState,L'S');
  Grammar::Grammar(&this->m_grammar,grammar);
  std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::vector
            (&this->m_tokens);
  std::
  stack<PDA::Transducer::StoreFst::State,std::deque<PDA::Transducer::StoreFst::State,std::allocator<PDA::Transducer::StoreFst::State>>>
  ::
  stack<std::deque<PDA::Transducer::StoreFst::State,std::allocator<PDA::Transducer::StoreFst::State>>,void>
            ((stack<PDA::Transducer::StoreFst::State,std::deque<PDA::Transducer::StoreFst::State,std::allocator<PDA::Transducer::StoreFst::State>>>
              *)&this->m_states);
  return;
}

Assistant:

StoreFst(const Grammar &grammar) : m_grammar(grammar)
    { }